

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O1

bool svd(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,int K,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *U,vector<double,_std::allocator<double>_> *S,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *V)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pdVar3;
  int iVar4;
  ulong uVar5;
  time_t tVar6;
  double *x;
  double *x_00;
  double *x_01;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __new_size;
  long lVar11;
  ulong uVar12;
  int n;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  int local_a0;
  value_type_conflict3 local_80;
  ulong local_78;
  void *local_70;
  double local_68;
  ulong local_60;
  ulong local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  uVar8 = (ulong)(uint)K;
  pvVar1 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)*(pointer *)
                 ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data;
  local_40 = A;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(U);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(V);
  pdVar3 = (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  uVar5 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  __new_size = (size_type)K;
  local_80 = 0.0;
  local_38 = S;
  std::vector<double,_std::allocator<double>_>::resize(S,__new_size,&local_80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(U,__new_size);
  local_a0 = (int)uVar5;
  local_78 = uVar8;
  if (0 < K) {
    lVar11 = 0;
    do {
      local_80 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((U->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar11),(long)local_a0,&local_80);
      lVar11 = lVar11 + 0x18;
    } while (uVar8 * 0x18 != lVar11);
  }
  local_50 = U;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(V,__new_size);
  if (0 < K) {
    lVar11 = local_78 * 0x18;
    lVar14 = 0;
    do {
      local_80 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((V->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar14),(long)(int)(uVar9 >> 3),&local_80);
      lVar14 = lVar14 + 0x18;
    } while (lVar11 != lVar14);
  }
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  local_58 = (long)(uVar5 << 0x20) >> 0x1d;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)(uVar5 << 0x20)) {
    uVar8 = local_58;
  }
  x = (double *)operator_new__(uVar8);
  x_00 = (double *)operator_new__(uVar8);
  local_60 = (long)(uVar9 * 0x20000000) >> 0x1d;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)(uVar9 * 0x20000000)) {
    uVar8 = local_60;
  }
  local_70 = operator_new__(uVar8);
  x_01 = (double *)operator_new__(uVar8);
  if (0 < K) {
    uVar5 = uVar5 & 0x7fffffff;
    uVar12 = (long)uVar9 >> 3 & 0x7fffffff;
    uVar8 = 0;
    local_48 = V;
    do {
      do {
        if (0 < local_a0) {
          uVar13 = 0;
          do {
            iVar4 = rand();
            x[uVar13] = (double)((float)iVar4 * 4.656613e-10);
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
        }
        dVar15 = normalize(x,local_a0);
      } while (dVar15 <= eps);
      dVar15 = -1.0;
      if ((eps <= 1.0) && (dVar15 = -1.0, 0 < MAX_ITER)) {
        iVar4 = 0;
        while( true ) {
          memset(x_00,0,local_58);
          memset(x_01,0,local_60);
          n = (int)((long)uVar9 >> 3);
          if (0 < local_a0) {
            uVar13 = 0;
            do {
              if (0 < n) {
                dVar15 = x[uVar13];
                lVar11 = *(long *)&(local_40->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar13].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                uVar10 = 0;
                do {
                  x_01[uVar10] = *(double *)(lVar11 + uVar10 * 8) * dVar15 + x_01[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar5);
          }
          dVar15 = normalize(x_01,n);
          if (dVar15 < eps) break;
          if (uVar8 != 0) {
            pvVar1 = (local_48->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar13 = 0;
            do {
              lVar11 = *(long *)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              dVar15 = 0.0;
              if (0 < n) {
                uVar10 = 0;
                do {
                  dVar15 = dVar15 + *(double *)(lVar11 + uVar10 * 8) * x_01[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
              }
              if (0 < n) {
                uVar10 = 0;
                do {
                  x_01[uVar10] = *(double *)(lVar11 + uVar10 * 8) * -dVar15 + x_01[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar8);
          }
          normalize(x_01,n);
          if (0 < local_a0) {
            uVar13 = 0;
            do {
              if (0 < n) {
                lVar11 = *(long *)&(local_40->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar13].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                dVar15 = x_00[uVar13];
                uVar10 = 0;
                do {
                  dVar15 = dVar15 + x_01[uVar10] * *(double *)(lVar11 + uVar10 * 8);
                  x_00[uVar13] = dVar15;
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar5);
          }
          dVar15 = normalize(x_00,local_a0);
          if (dVar15 < eps) break;
          if (uVar8 != 0) {
            pvVar1 = (local_50->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar13 = 0;
            do {
              lVar11 = *(long *)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              dVar16 = 0.0;
              if (0 < local_a0) {
                uVar10 = 0;
                do {
                  dVar16 = dVar16 + *(double *)(lVar11 + uVar10 * 8) * x_00[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar5 != uVar10);
              }
              if (0 < local_a0) {
                uVar10 = 0;
                do {
                  x_00[uVar10] = *(double *)(lVar11 + uVar10 * 8) * -dVar16 + x_00[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar5 != uVar10);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar8);
          }
          normalize(x_00,local_a0);
          if (local_a0 < 1) {
            local_68 = 0.0;
          }
          else {
            local_68 = 0.0;
            uVar13 = 0;
            do {
              local_68 = local_68 + (x_00[uVar13] - x[uVar13]) * (x_00[uVar13] - x[uVar13]);
              uVar13 = uVar13 + 1;
            } while (uVar5 != uVar13);
          }
          memcpy(x,x_00,local_58);
          memcpy(local_70,x_01,local_60);
          if ((local_68 < eps) || (iVar4 = iVar4 + 1, MAX_ITER <= iVar4)) break;
        }
      }
      local_68 = eps;
      if (eps <= dVar15) {
        (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] = dVar15;
        memcpy((local_50->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar8].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,x,local_58);
        memcpy((local_48->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar8].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,local_70,local_60);
      }
      else {
        poVar7 = std::ostream::_M_insert<double>(dVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
    } while ((local_68 <= dVar15) && (uVar8 = uVar8 + 1, uVar8 != local_78));
  }
  operator_delete__(x_00);
  operator_delete__(x_01);
  operator_delete__(x);
  operator_delete__(local_70);
  return true;
}

Assistant:

bool svd(vector<vector<double> > A, int K, vector<vector<double> > &U, vector<double> &S, vector<vector<double> > &V) {
	int M = A.size();
	int N = A[0].size();
	U.clear();
	V.clear();
	S.clear();
	S.resize(K, 0);
	U.resize(K);
	for (int i = 0; i < K; i++)
		U[i].resize(M, 0);
	V.resize(K);
	for (int i = 0; i < K; i++)
		V[i].resize(N, 0);


	srand(time(0));
	double *left_vector = new double[M];
	double *next_left_vector = new double[M];
	double *right_vector = new double[N];
	double *next_right_vector = new double[N];
	int col = 0;
	for (int col = 0; col < K; col++) {
		double diff = 1;
		double r = -1;
		while (1) {
			for (int i = 0; i < M; i++)
				left_vector[i] = (float)rand() / RAND_MAX;
			if (normalize(left_vector, M) > eps)
				break;
		}

		for (int iter = 0; diff >= eps && iter < MAX_ITER; iter++) {
			memset(next_left_vector, 0, sizeof(double)*M);
			memset(next_right_vector, 0, sizeof(double)*N);
			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_right_vector[j] += left_vector[i] * A[i][j];

			r = normalize(next_right_vector, N);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&V[i][0], next_right_vector, N);
			normalize(next_right_vector, N);

			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_left_vector[i] += next_right_vector[j] * A[i][j];
			r = normalize(next_left_vector, M);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&U[i][0], next_left_vector, M);
			normalize(next_left_vector, M);
			diff = 0;
			for (int i = 0; i < M; i++) {
				double d = next_left_vector[i] - left_vector[i];
				diff += d * d;
			}

			memcpy(left_vector, next_left_vector, sizeof(double)*M);
			memcpy(right_vector, next_right_vector, sizeof(double)*N);
		}
		if (r >= eps) {
			S[col] = r;
			memcpy((char *)&U[col][0], left_vector, sizeof(double)*M);
			memcpy((char *)&V[col][0], right_vector, sizeof(double)*N);
		}
		else {
			cout << r << endl;
			break;
		}
	}
	delete[] next_left_vector;
	delete[] next_right_vector;
	delete[] left_vector;
	delete[] right_vector;

	return true;
}